

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void CleanBodyAttrs(TidyDocImpl *doc,Node *body)

{
  Lexer *lexer_00;
  AttVal *pAVar1;
  AttVal *attr;
  tmbstr color;
  tmbstr bgcolor;
  tmbstr bgurl;
  Lexer *lexer;
  Node *body_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  bgcolor = (tmbstr)0x0;
  color = (tmbstr)0x0;
  attr = (AttVal *)0x0;
  pAVar1 = prvTidyAttrGetById(body,TidyAttr_BACKGROUND);
  if (pAVar1 != (AttVal *)0x0) {
    bgcolor = pAVar1->value;
    pAVar1->value = (tmbstr)0x0;
    prvTidyRemoveAttribute(doc,body,pAVar1);
  }
  pAVar1 = prvTidyAttrGetById(body,TidyAttr_BGCOLOR);
  if (pAVar1 != (AttVal *)0x0) {
    color = pAVar1->value;
    pAVar1->value = (tmbstr)0x0;
    prvTidyRemoveAttribute(doc,body,pAVar1);
  }
  pAVar1 = prvTidyAttrGetById(body,TidyAttr_TEXT);
  if (pAVar1 != (AttVal *)0x0) {
    attr = (AttVal *)pAVar1->value;
    pAVar1->value = (tmbstr)0x0;
    prvTidyRemoveAttribute(doc,body,pAVar1);
  }
  if (((bgcolor != (tmbstr)0x0) || (color != (tmbstr)0x0)) || (attr != (AttVal *)0x0)) {
    prvTidyAddStringLiteral(lexer_00," body {\n");
    if (bgcolor != (tmbstr)0x0) {
      prvTidyAddStringLiteral(lexer_00,"  background-image: url(");
      prvTidyAddStringLiteral(lexer_00,bgcolor);
      prvTidyAddStringLiteral(lexer_00,");\n");
      (*doc->allocator->vtbl->free)(doc->allocator,bgcolor);
    }
    if (color != (tmbstr)0x0) {
      prvTidyAddStringLiteral(lexer_00,"  background-color: ");
      prvTidyAddStringLiteral(lexer_00,color);
      prvTidyAddStringLiteral(lexer_00,";\n");
      (*doc->allocator->vtbl->free)(doc->allocator,color);
    }
    if (attr != (AttVal *)0x0) {
      prvTidyAddStringLiteral(lexer_00,"  color: ");
      prvTidyAddStringLiteral(lexer_00,(ctmbstr)attr);
      prvTidyAddStringLiteral(lexer_00,";\n");
      (*doc->allocator->vtbl->free)(doc->allocator,attr);
    }
    prvTidyAddStringLiteral(lexer_00," }\n");
  }
  pAVar1 = prvTidyAttrGetById(body,TidyAttr_LINK);
  if (pAVar1 != (AttVal *)0x0) {
    AddColorRule(lexer_00," :link",pAVar1->value);
    prvTidyRemoveAttribute(doc,body,pAVar1);
  }
  pAVar1 = prvTidyAttrGetById(body,TidyAttr_VLINK);
  if (pAVar1 != (AttVal *)0x0) {
    AddColorRule(lexer_00," :visited",pAVar1->value);
    prvTidyRemoveAttribute(doc,body,pAVar1);
  }
  pAVar1 = prvTidyAttrGetById(body,TidyAttr_ALINK);
  if (pAVar1 != (AttVal *)0x0) {
    AddColorRule(lexer_00," :active",pAVar1->value);
    prvTidyRemoveAttribute(doc,body,pAVar1);
  }
  return;
}

Assistant:

static void CleanBodyAttrs( TidyDocImpl* doc, Node* body )
{
    Lexer* lexer  = doc->lexer;
    tmbstr bgurl   = NULL;
    tmbstr bgcolor = NULL;
    tmbstr color   = NULL;
    AttVal* attr;
    
    if (NULL != (attr = TY_(AttrGetById)(body, TidyAttr_BACKGROUND)))
    {
        bgurl = attr->value;
        attr->value = NULL;
        TY_(RemoveAttribute)( doc, body, attr );
    }

    if (NULL != (attr = TY_(AttrGetById)(body, TidyAttr_BGCOLOR)))
    {
        bgcolor = attr->value;
        attr->value = NULL;
        TY_(RemoveAttribute)( doc, body, attr );
    }

    if (NULL != (attr = TY_(AttrGetById)(body, TidyAttr_TEXT)))
    {
        color = attr->value;
        attr->value = NULL;
        TY_(RemoveAttribute)( doc, body, attr );
    }

    if ( bgurl || bgcolor || color )
    {
        TY_(AddStringLiteral)(lexer, " body {\n");
        if (bgurl)
        {
            TY_(AddStringLiteral)(lexer, "  background-image: url(");
            TY_(AddStringLiteral)(lexer, bgurl);
            TY_(AddStringLiteral)(lexer, ");\n");
            TidyDocFree(doc, bgurl);
        }
        if (bgcolor)
        {
            TY_(AddStringLiteral)(lexer, "  background-color: ");
            TY_(AddStringLiteral)(lexer, bgcolor);
            TY_(AddStringLiteral)(lexer, ";\n");
            TidyDocFree(doc, bgcolor);
        }
        if (color)
        {
            TY_(AddStringLiteral)(lexer, "  color: ");
            TY_(AddStringLiteral)(lexer, color);
            TY_(AddStringLiteral)(lexer, ";\n");
            TidyDocFree(doc, color);
        }

        TY_(AddStringLiteral)(lexer, " }\n");
    }

    if (NULL != (attr = TY_(AttrGetById)(body, TidyAttr_LINK)))
    {
        AddColorRule(lexer, " :link", attr->value);
        TY_(RemoveAttribute)( doc, body, attr );
    }

    if (NULL != (attr = TY_(AttrGetById)(body, TidyAttr_VLINK)))
    {
        AddColorRule(lexer, " :visited", attr->value);
        TY_(RemoveAttribute)( doc, body, attr );
    }

    if (NULL != (attr = TY_(AttrGetById)(body, TidyAttr_ALINK)))
    {
        AddColorRule(lexer, " :active", attr->value);
        TY_(RemoveAttribute)( doc, body, attr );
    }
}